

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O0

void __thiscall CubicLattice::createUpEdgesMap(CubicLattice *this)

{
  double dVar1;
  double dVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar3;
  long *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_vector<vector<int>_>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  invalid_argument *e_23;
  invalid_argument *e_22;
  invalid_argument *e_21;
  invalid_argument *e_20;
  invalid_argument *e_19;
  invalid_argument *e_18;
  invalid_argument *e_17;
  invalid_argument *e_16;
  invalid_argument *e_15;
  invalid_argument *e_14;
  invalid_argument *e_13;
  invalid_argument *e_12;
  invalid_argument *e_11;
  invalid_argument *e_10;
  invalid_argument *e_9;
  invalid_argument *e_8;
  invalid_argument *e_7;
  invalid_argument *e_6;
  invalid_argument *e_5;
  invalid_argument *e_4;
  invalid_argument *e_3;
  invalid_argument *e_2;
  invalid_argument *e_1;
  invalid_argument *e;
  int vertexIndex;
  vvint vertexToUpEdges;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *direction;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directionList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff4b8;
  undefined7 in_stack_fffffffffffff4c0;
  undefined1 in_stack_fffffffffffff4c7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  in_stack_fffffffffffff4c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *in_stack_fffffffffffff4d0;
  undefined4 in_stack_fffffffffffff4d8;
  undefined4 in_stack_fffffffffffff4dc;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff4f0;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffff4f8;
  undefined4 in_stack_fffffffffffff4fc;
  size_type in_stack_fffffffffffff500;
  string *local_7c8;
  allocator local_6d9;
  string local_6d8 [36];
  undefined4 local_6b4;
  allocator local_6a1;
  string local_6a0 [36];
  undefined4 local_67c;
  allocator local_669;
  string local_668 [36];
  undefined4 local_644;
  allocator local_631;
  string local_630 [36];
  undefined4 local_60c;
  allocator local_5f9;
  string local_5f8 [36];
  undefined4 local_5d4;
  allocator local_5c1;
  string local_5c0 [36];
  undefined4 local_59c;
  allocator local_589;
  string local_588 [36];
  undefined4 local_564;
  allocator local_551;
  string local_550 [36];
  undefined4 local_52c;
  allocator local_519;
  string local_518 [36];
  undefined4 local_4f4;
  allocator local_4e1;
  string local_4e0 [36];
  undefined4 local_4bc;
  allocator local_4a9;
  string local_4a8 [36];
  undefined4 local_484;
  allocator local_471;
  string local_470 [36];
  undefined4 local_44c;
  allocator local_439;
  string local_438 [36];
  undefined4 local_414;
  allocator local_401;
  string local_400 [36];
  undefined4 local_3dc;
  allocator local_3c9;
  string local_3c8 [36];
  undefined4 local_3a4;
  allocator local_391;
  string local_390 [36];
  undefined4 local_36c;
  allocator local_359;
  string local_358 [36];
  undefined4 local_334;
  allocator local_321;
  string local_320 [36];
  undefined4 local_2fc;
  allocator local_2e9;
  string local_2e8 [36];
  undefined4 local_2c4;
  allocator local_2b1;
  string local_2b0 [36];
  undefined4 local_28c;
  allocator local_279;
  string local_278 [36];
  undefined4 local_254;
  allocator local_241;
  string local_240 [36];
  undefined4 local_21c;
  allocator local_209;
  string local_208 [36];
  undefined4 local_1e4;
  allocator local_1d1;
  string local_1d0 [32];
  undefined4 local_1b0;
  int local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_190;
  reference local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  undefined1 *local_160;
  undefined1 local_154;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  allocator local_150;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d [20];
  allocator local_139;
  string *local_138;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_154 = 1;
  local_138 = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"xyz",&local_139);
  local_138 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"xy",local_14d);
  local_138 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"xz",&local_14e);
  local_138 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"yz",&local_14f);
  local_138 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"-xyz",&local_150);
  local_138 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"-xy",&local_151);
  local_138 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"-xz",&local_152);
  local_138 = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"-yz",&local_153);
  local_154 = 0;
  local_30 = local_130;
  local_28 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x186828);
  __l._M_array._4_4_ = in_stack_fffffffffffff4fc;
  __l._M_array._0_4_ = in_stack_fffffffffffff4f8;
  __l._M_len = in_stack_fffffffffffff500;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffff4f0,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x18685c);
  local_7c8 = (string *)&local_30;
  do {
    local_7c8 = local_7c8 + -0x20;
    std::__cxx11::string::~string(local_7c8);
  } while (local_7c8 != local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_153);
  std::allocator<char>::~allocator((allocator<char> *)&local_152);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::~allocator((allocator<char> *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e);
  std::allocator<char>::~allocator((allocator<char> *)local_14d);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  local_160 = local_20;
  local_168._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffff4b8);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(in_stack_fffffffffffff4b8);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff4b8), bVar3) {
    local_178 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_168);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x18699a);
    pow((double)(int)in_RDI[1],3.0);
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_198 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x186a0e);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
             (size_type)in_stack_fffffffffffff4b8,(value_type *)0x186a2b);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff4d0);
    for (local_1ac = 0; dVar1 = (double)local_1ac, dVar2 = pow((double)(int)in_RDI[1],3.0),
        dVar1 < dVar2; local_1ac = local_1ac + 1) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                              (char *)in_stack_fffffffffffff4b8);
      if (bVar3) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](&local_190,(long)local_1ac);
        iVar5 = local_1ac;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d0,"x",&local_1d1);
        local_1b0 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_1d0,1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                   (value_type_conflict1 *)in_stack_fffffffffffff4b8);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](&local_190,(long)local_1ac);
        iVar5 = local_1ac;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"y",&local_209);
        local_1e4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_208,1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                   (value_type_conflict1 *)in_stack_fffffffffffff4b8);
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](&local_190,(long)local_1ac);
        iVar5 = local_1ac;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,"z",&local_241);
        local_21c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_240,1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                   (value_type_conflict1 *)in_stack_fffffffffffff4b8);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                                (char *)in_stack_fffffffffffff4b8);
        if (bVar3) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[](&local_190,(long)local_1ac);
          iVar5 = local_1ac;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_278,"x",&local_279);
          local_254 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_278,1);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                     (value_type_conflict1 *)in_stack_fffffffffffff4b8);
          std::__cxx11::string::~string(local_278);
          std::allocator<char>::~allocator((allocator<char> *)&local_279);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[](&local_190,(long)local_1ac);
          iVar5 = local_1ac;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2b0,"y",&local_2b1);
          local_28c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_2b0,1);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                     (value_type_conflict1 *)in_stack_fffffffffffff4b8);
          std::__cxx11::string::~string(local_2b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[](&local_190,(long)local_1ac);
          iVar5 = local_1ac;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e8,"z",&local_2e9);
          local_2c4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_2e8,0xffffffff);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                     (value_type_conflict1 *)in_stack_fffffffffffff4b8);
          std::__cxx11::string::~string(local_2e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                                  (char *)in_stack_fffffffffffff4b8);
          if (bVar3) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&local_190,(long)local_1ac);
            iVar5 = local_1ac;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_320,"x",&local_321);
            local_2fc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_320,1);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                       (value_type_conflict1 *)in_stack_fffffffffffff4b8);
            std::__cxx11::string::~string(local_320);
            std::allocator<char>::~allocator((allocator<char> *)&local_321);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&local_190,(long)local_1ac);
            iVar5 = local_1ac;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_358,"y",&local_359);
            local_334 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_358,0xffffffff);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                       (value_type_conflict1 *)in_stack_fffffffffffff4b8);
            std::__cxx11::string::~string(local_358);
            std::allocator<char>::~allocator((allocator<char> *)&local_359);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&local_190,(long)local_1ac);
            iVar5 = local_1ac;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_390,"z",&local_391);
            local_36c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_390,1);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                       (value_type_conflict1 *)in_stack_fffffffffffff4b8);
            std::__cxx11::string::~string(local_390);
            std::allocator<char>::~allocator((allocator<char> *)&local_391);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0)
                                    ,(char *)in_stack_fffffffffffff4b8);
            if (bVar3) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&local_190,(long)local_1ac);
              iVar5 = local_1ac;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3c8,"x",&local_3c9);
              local_3a4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_3c8,0xffffffff);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                         (value_type_conflict1 *)in_stack_fffffffffffff4b8);
              std::__cxx11::string::~string(local_3c8);
              std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&local_190,(long)local_1ac);
              iVar5 = local_1ac;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_400,"y",&local_401);
              local_3dc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_400,1);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                         (value_type_conflict1 *)in_stack_fffffffffffff4b8);
              std::__cxx11::string::~string(local_400);
              std::allocator<char>::~allocator((allocator<char> *)&local_401);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&local_190,(long)local_1ac);
              iVar5 = local_1ac;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_438,"z",&local_439);
              local_414 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_438,1);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                         (value_type_conflict1 *)in_stack_fffffffffffff4b8);
              std::__cxx11::string::~string(local_438);
              std::allocator<char>::~allocator((allocator<char> *)&local_439);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffff4c7,
                                                  in_stack_fffffffffffff4c0),
                                      (char *)in_stack_fffffffffffff4b8);
              if (bVar3) {
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_190,(long)local_1ac);
                iVar5 = local_1ac;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_470,"x",&local_471);
                local_44c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_470,0xffffffff);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                           (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                std::__cxx11::string::~string(local_470);
                std::allocator<char>::~allocator((allocator<char> *)&local_471);
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_190,(long)local_1ac);
                iVar5 = local_1ac;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4a8,"y",&local_4a9);
                local_484 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_4a8,0xffffffff);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                           (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                std::__cxx11::string::~string(local_4a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_190,(long)local_1ac);
                iVar5 = local_1ac;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4e0,"z",&local_4e1);
                local_4bc = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_4e0,0xffffffff);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                           (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                std::__cxx11::string::~string(local_4e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffff4c7,
                                                    in_stack_fffffffffffff4c0),
                                        (char *)in_stack_fffffffffffff4b8);
                if (bVar3) {
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar5 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_518,"x",&local_519);
                  local_4f4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_518,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                             (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                  std::__cxx11::string::~string(local_518);
                  std::allocator<char>::~allocator((allocator<char> *)&local_519);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar5 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_550,"y",&local_551);
                  local_52c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_550,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                             (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                  std::__cxx11::string::~string(local_550);
                  std::allocator<char>::~allocator((allocator<char> *)&local_551);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_190,(long)local_1ac);
                  iVar5 = local_1ac;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_588,"z",&local_589);
                  local_564 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_588,1);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                             (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                  std::__cxx11::string::~string(local_588);
                  std::allocator<char>::~allocator((allocator<char> *)&local_589);
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffff4c7,
                                                      in_stack_fffffffffffff4c0),
                                          (char *)in_stack_fffffffffffff4b8);
                  if (bVar3) {
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar5 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_5c0,"x",&local_5c1);
                    local_59c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_5c0,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                               (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                    std::__cxx11::string::~string(local_5c0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar5 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_5f8,"y",&local_5f9);
                    local_5d4 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_5f8,1);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                               (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                    std::__cxx11::string::~string(local_5f8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_190,(long)local_1ac);
                    iVar5 = local_1ac;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_630,"z",&local_631);
                    local_60c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_630,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                               (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                    std::__cxx11::string::~string(local_630);
                    std::allocator<char>::~allocator((allocator<char> *)&local_631);
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffff4c7,
                                                        in_stack_fffffffffffff4c0),
                                            (char *)in_stack_fffffffffffff4b8);
                    if (bVar3) {
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar5 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_668,"x",&local_669);
                      local_644 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_668,1);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                                 (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                      std::__cxx11::string::~string(local_668);
                      std::allocator<char>::~allocator((allocator<char> *)&local_669);
                      std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_190,(long)local_1ac);
                      iVar5 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_6a0,"y",&local_6a1);
                      local_67c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_6a0,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                                 (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                      std::__cxx11::string::~string(local_6a0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
                      in_stack_fffffffffffff4e0 =
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                            *)std::
                              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ::operator[](&local_190,(long)local_1ac);
                      paVar6 = &local_6d9;
                      iVar5 = local_1ac;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_6d8,"z",paVar6);
                      in_stack_fffffffffffff4dc =
                           (**(code **)(*in_RDI + 0x10))(in_RDI,iVar5,local_6d8,0xffffffff);
                      local_6b4 = in_stack_fffffffffffff4dc;
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
                                 (value_type_conflict1 *)in_stack_fffffffffffff4b8);
                      std::__cxx11::string::~string(local_6d8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    in_stack_fffffffffffff4d0 =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          *)(in_RDI + 0xb);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::
    pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&,_true>
              (in_stack_fffffffffffff4e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_fffffffffffff4d0);
    _Var4 = std::
            map<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
            ::
            insert<std::pair<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
                      (in_stack_fffffffffffff4d0,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                        *)in_stack_fffffffffffff4c8._M_node);
    in_stack_fffffffffffff4c8 = _Var4.first._M_node;
    in_stack_fffffffffffff4c7 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffff4d0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_168);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff4d0);
  return;
}

Assistant:

void CubicLattice::createUpEdgesMap()
{
    std::vector<std::string> directionList = {"xyz", "xy", "xz", "yz",
                                              "-xyz", "-xy", "-xz", "-yz"};
    for (const auto &direction : directionList)
    {
        vvint vertexToUpEdges;
        vertexToUpEdges.assign(pow(l, 3), {});
        for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
        {
            // cartesian4 coordinate = indexToCoordinate(vertexIndex);
            if (direction == "xyz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                    // Edge to vertex outside lattice
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "xy")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "xz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "yz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xyz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xy")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-yz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
        }
        upEdgesMap.insert(std::pair<std::string, vvint>(direction, vertexToUpEdges));
    }
}